

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

TiXmlNode * __thiscall despot::util::tinyxml::TiXmlUnknown::Clone(TiXmlUnknown *this)

{
  TiXmlNode *target;
  
  target = (TiXmlNode *)operator_new(0x50);
  TiXmlUnknown((TiXmlUnknown *)target);
  TiXmlNode::CopyTo(&this->super_TiXmlNode,target);
  return target;
}

Assistant:

TiXmlNode* TiXmlUnknown::Clone() const {
	TiXmlUnknown* clone = new TiXmlUnknown();

	if (!clone)
		return 0;

	CopyTo(clone);
	return clone;
}